

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> * __thiscall
duckdb::BoxRenderer::PivotCollections
          (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           *__return_storage_ptr__,BoxRenderer *this,ClientContext *context,
          list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> *input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_names,vector<duckdb::LogicalType,_true> *result_types,idx_t row_count)

{
  ColumnDataCollection *pCVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pointer pcVar5;
  pointer pLVar6;
  list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *this_00;
  ClientContext *__args;
  idx_t index;
  char cVar7;
  bool bVar8;
  long *plVar9;
  _List_node_base *p_Var10;
  undefined8 *puVar11;
  type allocator;
  _Node *p_Var12;
  reference pvVar13;
  reference type;
  DataChunk *this_01;
  size_type *psVar14;
  ulong uVar15;
  LogicalType *this_02;
  _List_node_base *p_Var16;
  idx_t index_00;
  char cVar17;
  long lVar18;
  ulong __val;
  pointer __n;
  initializer_list<unsigned_long> __l;
  vector<duckdb::LogicalType,_true> varchar_types;
  list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> *result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  new_names;
  ColumnDataChunkIterator __begin3;
  vector<unsigned_long,_true> column_ids;
  string __str;
  ColumnDataAppendState append_state;
  DataChunk row_chunk;
  _List_node_base *local_348;
  vector<duckdb::LogicalType,_true> local_338;
  list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *local_320;
  ClientContext *local_318;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_308;
  _List_node_base *local_300;
  pointer local_2f8;
  pointer pbStack_2f0;
  pointer local_2e8;
  BoxRenderer *local_2e0;
  string local_2d8;
  undefined1 local_2b8 [112];
  pointer local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  string local_200;
  undefined1 local_1e0 [112];
  pointer local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  void *local_140 [3];
  ColumnDataChunkIterationHelper local_128;
  ColumnDataAppendState local_108;
  DataChunk local_b0;
  Value local_70;
  
  p_Var3 = (input->
           super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = (input->
           super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (LogicalType *)0x0;
  local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (LogicalType *)0x0;
  local_2e8 = (pointer)0x0;
  local_2f8 = (pointer)0x0;
  pbStack_2f0 = (pointer)0x0;
  local_320 = (list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> *)
              __return_storage_ptr__;
  local_318 = context;
  local_310 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)result_types;
  local_308 = column_names;
  local_300 = (_List_node_base *)input;
  local_2e0 = this;
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[7]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
             (char (*) [7])0x139fecd);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
             (char (*) [5])0x147c0da);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_338,
             &LogicalType::VARCHAR);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_338,
             &LogicalType::VARCHAR);
  pCVar1 = (ColumnDataCollection *)(local_1e0 + 0x10);
  plVar2 = (long *)(local_2b8 + 0x10);
  p_Var10 = (_List_node_base *)0x0;
  do {
    if (p_Var3[3]._M_prev <= p_Var10) {
      p_Var10 = p_Var4[3]._M_prev;
      if (p_Var10 != (_List_node_base *)0x0) {
        p_Var16 = (_List_node_base *)0x0;
        do {
          __val = (long)p_Var16 + ((row_count + 1) - (long)p_Var10);
          cVar17 = '\x01';
          if (9 < __val) {
            uVar15 = __val;
            cVar7 = '\x04';
            do {
              cVar17 = cVar7;
              if (uVar15 < 100) {
                cVar17 = cVar17 + -2;
                goto LAB_00371dbc;
              }
              if (uVar15 < 1000) {
                cVar17 = cVar17 + -1;
                goto LAB_00371dbc;
              }
              if (uVar15 < 10000) goto LAB_00371dbc;
              bVar8 = 99999 < uVar15;
              uVar15 = uVar15 / 10000;
              cVar7 = cVar17 + '\x04';
            } while (bVar8);
            cVar17 = cVar17 + '\x01';
          }
LAB_00371dbc:
          local_1e0._0_8_ = pCVar1;
          ::std::__cxx11::string::_M_construct((ulong)local_1e0,cVar17);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_1e0._0_8_,local_1e0._8_4_,__val);
          puVar11 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x1333e75);
          psVar14 = puVar11 + 2;
          if ((size_type *)*puVar11 == psVar14) {
            local_2b8._16_8_ = *psVar14;
            local_2b8._24_8_ = puVar11[3];
            local_2b8._0_8_ = plVar2;
          }
          else {
            local_2b8._16_8_ = *psVar14;
            local_2b8._0_8_ = (size_type *)*puVar11;
          }
          local_2b8._8_8_ = puVar11[1];
          *puVar11 = psVar14;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                    );
          if ((long *)local_2b8._0_8_ != plVar2) {
            operator_delete((void *)local_2b8._0_8_);
          }
          if ((ColumnDataCollection *)local_1e0._0_8_ != pCVar1) {
            operator_delete((void *)local_1e0._0_8_);
          }
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_338,
                     &LogicalType::VARCHAR);
          p_Var16 = (_List_node_base *)((long)&p_Var16->_M_next + 1);
          p_Var10 = p_Var4[3]._M_prev;
        } while (p_Var16 < p_Var10);
      }
      DataChunk::DataChunk(&local_b0);
      Allocator::DefaultAllocatorReference();
      __args = local_318;
      allocator = shared_ptr<duckdb::Allocator,_true>::operator*
                            (&Allocator::DefaultAllocatorReference::DEFAULT_ALLOCATOR);
      DataChunk::Initialize(&local_b0,allocator,&local_338,0x800);
      this_00 = local_320;
      *(list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> **)
       (local_320 + 8) = local_320;
      *(list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>> **)local_320
           = local_320;
      *(undefined8 *)(local_320 + 0x10) = 0;
      p_Var12 = ::std::__cxx11::
                list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>>::
                _M_create_node<duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
                          (local_320,__args,&local_338);
      ::std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var12);
      *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 1;
      p_Var12 = ::std::__cxx11::
                list<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>>::
                _M_create_node<duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
                          (this_00,__args,&local_338);
      ::std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var12);
      *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 1;
      local_318 = (ClientContext *)(*(long *)this_00 + 0x10);
      local_108.current_chunk_state.handles._M_h._M_buckets =
           &local_108.current_chunk_state.handles._M_h._M_single_bucket;
      local_108.current_chunk_state.handles._M_h._M_bucket_count = 1;
      local_108.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_108.current_chunk_state.handles._M_h._M_element_count = 0;
      local_108.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_108.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
      local_108.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_108.current_chunk_state.properties = INVALID;
      local_108.vector_data.
      super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.vector_data.
      super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.vector_data.
      super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ColumnDataCollection::InitializeAppend((ColumnDataCollection *)local_318,&local_108);
      if (p_Var3[2]._M_prev != p_Var3[2]._M_next) {
        __n = (pointer)0x0;
        do {
          __l._M_len = 1;
          __l._M_array = (iterator)local_2b8;
          local_2b8._0_8_ = __n;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218,__l,
                     (allocator_type *)local_1e0);
          index = local_b0.count;
          pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](local_308,(size_type)__n);
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          pcVar5 = (pvVar13->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,pcVar5,pcVar5 + pvVar13->_M_string_length);
          Value::Value((Value *)local_2b8,&local_2d8);
          DataChunk::SetValue(&local_b0,0,index,(Value *)local_2b8);
          Value::~Value((Value *)local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p);
          }
          type = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)local_310,(size_type)__n);
          RenderType_abi_cxx11_(&local_200,local_2e0,type);
          Value::Value((Value *)local_2b8,&local_200);
          DataChunk::SetValue(&local_b0,1,index,(Value *)local_2b8);
          Value::~Value((Value *)local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          local_348 = (((_List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                         *)&local_300->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (local_348 != local_300) {
            lVar18 = 2;
            do {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_140,
                         &local_218);
              ColumnDataCollection::Chunks
                        (&local_128,(ColumnDataCollection *)(local_348 + 1),
                         (vector<unsigned_long,_true> *)local_140);
              if (local_140[0] != (void *)0x0) {
                operator_delete(local_140[0]);
              }
              ColumnDataChunkIterationHelper::begin((ColumnDataChunkIterator *)local_2b8,&local_128)
              ;
              ColumnDataChunkIterationHelper::end((ColumnDataChunkIterator *)local_1e0,&local_128);
              while( true ) {
                bVar8 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                                  ((ColumnDataChunkIterator *)local_2b8,
                                   (ColumnDataChunkIterator *)local_1e0);
                if (!bVar8) break;
                this_01 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                                    ((ColumnDataChunkIterator *)local_2b8);
                if (this_01->count != 0) {
                  index_00 = 0;
                  do {
                    DataChunk::GetValue(&local_70,this_01,0,index_00);
                    DataChunk::SetValue(&local_b0,lVar18 + index_00,index,&local_70);
                    Value::~Value(&local_70);
                    index_00 = index_00 + 1;
                  } while (index_00 < this_01->count);
                  lVar18 = lVar18 + index_00;
                }
                ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++
                          ((ColumnDataChunkIterator *)local_2b8);
              }
              if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
              }
              if (local_170 != (pointer)0x0) {
                operator_delete(local_170);
              }
              ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)(local_1e0 + 8));
              if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
              }
              if (local_248 != (pointer)0x0) {
                operator_delete(local_248);
              }
              ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)(local_2b8 + 8));
              if (local_128.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_128.column_ids.
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              local_348 = (((_List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                             *)&local_348->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (local_348 != local_300);
          }
          local_b0.count = local_b0.count + 1;
          if ((local_b0.count == 0x800) ||
             (__n + 1 ==
              (pointer)(((long)p_Var3[2]._M_prev - (long)p_Var3[2]._M_next >> 3) *
                       -0x5555555555555555))) {
            ColumnDataCollection::Append((ColumnDataCollection *)local_318,&local_108,&local_b0);
            DataChunk::Reset(&local_b0);
          }
          if (local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          __n = __n + 1;
        } while (__n < (pointer)(((long)p_Var3[2]._M_prev - (long)p_Var3[2]._M_next >> 3) *
                                -0x5555555555555555));
      }
      local_2b8._16_8_ =
           (local_308->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_308->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2e8;
      local_2b8._0_8_ =
           (local_308->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2b8._8_8_ =
           (local_308->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_308->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_2f8;
      (local_308->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbStack_2f0;
      local_2f8 = (pointer)0x0;
      pbStack_2f0 = (pointer)0x0;
      local_2e8 = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b8);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (local_310,&local_338);
      ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
      ~vector(&local_108.vector_data.
               super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             );
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_108);
      DataChunk::~DataChunk(&local_b0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2f8);
      pLVar6 = local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (this_02 = local_338.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start; this_02 != pLVar6;
          this_02 = this_02 + 1) {
        LogicalType::~LogicalType(this_02);
      }
      if (local_338.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start != (LogicalType *)0x0) {
        operator_delete(local_338.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> *)
             local_320;
    }
    p_Var16 = (_List_node_base *)((long)&p_Var10->_M_next + 1);
    cVar17 = '\x01';
    if ((_List_node_base *)0x8 < p_Var10) {
      p_Var10 = p_Var16;
      cVar7 = '\x04';
      do {
        cVar17 = cVar7;
        if (p_Var10 < (_List_node_base *)0x64) {
          cVar17 = cVar17 + -2;
          goto LAB_00371c5f;
        }
        if (p_Var10 < (_List_node_base *)0x3e8) {
          cVar17 = cVar17 + -1;
          goto LAB_00371c5f;
        }
        if (p_Var10 < (_List_node_base *)0x2710) goto LAB_00371c5f;
        bVar8 = (_List_node_base *)0x1869f < p_Var10;
        p_Var10 = (_List_node_base *)((ulong)p_Var10 / 10000);
        cVar7 = cVar17 + '\x04';
      } while (bVar8);
      cVar17 = cVar17 + '\x01';
    }
LAB_00371c5f:
    local_1e0._0_8_ = pCVar1;
    ::std::__cxx11::string::_M_construct((ulong)local_1e0,cVar17);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_1e0._0_8_,local_1e0._8_4_,(unsigned_long)p_Var16);
    plVar9 = (long *)::std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x1333e75);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar14) {
      local_2b8._16_8_ = *psVar14;
      local_2b8._24_8_ = plVar9[3];
      local_2b8._0_8_ = plVar2;
    }
    else {
      local_2b8._16_8_ = *psVar14;
      local_2b8._0_8_ = (size_type *)*plVar9;
    }
    local_2b8._8_8_ = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    if ((long *)local_2b8._0_8_ != plVar2) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((ColumnDataCollection *)local_1e0._0_8_ != pCVar1) {
      operator_delete((void *)local_1e0._0_8_);
    }
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_338,
               &LogicalType::VARCHAR);
    p_Var10 = p_Var16;
  } while( true );
}

Assistant:

list<ColumnDataCollection> BoxRenderer::PivotCollections(ClientContext &context, list<ColumnDataCollection> input,
                                                         vector<string> &column_names,
                                                         vector<LogicalType> &result_types, idx_t row_count) {
	auto &top = input.front();
	auto &bottom = input.back();

	vector<LogicalType> varchar_types;
	vector<string> new_names;
	new_names.emplace_back("Column");
	new_names.emplace_back("Type");
	varchar_types.emplace_back(LogicalType::VARCHAR);
	varchar_types.emplace_back(LogicalType::VARCHAR);
	for (idx_t r = 0; r < top.Count(); r++) {
		new_names.emplace_back("Row " + to_string(r + 1));
		varchar_types.emplace_back(LogicalType::VARCHAR);
	}
	for (idx_t r = 0; r < bottom.Count(); r++) {
		auto row_index = row_count - bottom.Count() + r + 1;
		new_names.emplace_back("Row " + to_string(row_index));
		varchar_types.emplace_back(LogicalType::VARCHAR);
	}
	//
	DataChunk row_chunk;
	row_chunk.Initialize(Allocator::DefaultAllocator(), varchar_types);
	std::list<ColumnDataCollection> result;
	result.emplace_back(context, varchar_types);
	result.emplace_back(context, varchar_types);
	auto &res_coll = result.front();
	ColumnDataAppendState append_state;
	res_coll.InitializeAppend(append_state);
	for (idx_t c = 0; c < top.ColumnCount(); c++) {
		vector<column_t> column_ids {c};
		auto row_index = row_chunk.size();
		idx_t current_index = 0;
		row_chunk.SetValue(current_index++, row_index, column_names[c]);
		row_chunk.SetValue(current_index++, row_index, RenderType(result_types[c]));
		for (auto &collection : input) {
			for (auto &chunk : collection.Chunks(column_ids)) {
				for (idx_t r = 0; r < chunk.size(); r++) {
					row_chunk.SetValue(current_index++, row_index, chunk.GetValue(0, r));
				}
			}
		}
		row_chunk.SetCardinality(row_chunk.size() + 1);
		if (row_chunk.size() == STANDARD_VECTOR_SIZE || c + 1 == top.ColumnCount()) {
			res_coll.Append(append_state, row_chunk);
			row_chunk.Reset();
		}
	}
	column_names = std::move(new_names);
	result_types = std::move(varchar_types);
	return result;
}